

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool crnlib::rg_etc1::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint16 packed_delta3,uint table_idx)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  component_t cVar8;
  ulong uVar9;
  uint b;
  uint g;
  uint r;
  
  uVar9 = (ulong)table_idx;
  bVar2 = unpack_color5(&r,&g,&b,packed_color5,packed_delta3,true,0xff);
  iVar6 = (&g_etc1_inten_tables)[uVar9 * 4];
  iVar7 = iVar6 + r;
  iVar3 = iVar6 + g;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar4 = 0xff;
  if (0xfe < iVar3) {
    iVar3 = iVar4;
  }
  iVar5 = (&DAT_0018f2e4)[uVar9 * 4];
  iVar1 = iVar6 + b;
  if ((int)(iVar6 + b) < 1) {
    iVar1 = 0;
  }
  (pDst->field_0).field_0.r = (component_t)iVar7;
  if (0xfe < iVar1) {
    iVar1 = iVar4;
  }
  (pDst->field_0).field_0.g = (component_t)iVar3;
  (pDst->field_0).field_0.b = (component_t)iVar1;
  iVar7 = iVar5 + r;
  iVar3 = iVar5 + g;
  iVar5 = iVar5 + b;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = iVar4;
  }
  (pDst->field_0).field_0.a = 0xff;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  pDst[1].field_0.field_0.r = (component_t)iVar7;
  cVar8 = (component_t)iVar3;
  if (0xfe < iVar3) {
    cVar8 = 0xff;
  }
  pDst[1].field_0.field_0.g = cVar8;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  cVar8 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar8 = 0xff;
  }
  pDst[1].field_0.field_0.b = cVar8;
  pDst[1].field_0.field_0.a = 0xff;
  iVar6 = *(int *)(&DAT_0018f2e8 + uVar9 * 0x10);
  iVar7 = iVar6 + r;
  iVar3 = iVar6 + g;
  iVar6 = iVar6 + b;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  pDst[2].field_0.field_0.r = (component_t)iVar7;
  cVar8 = (component_t)iVar3;
  if (0xfe < iVar3) {
    cVar8 = 0xff;
  }
  pDst[2].field_0.field_0.g = cVar8;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  cVar8 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar8 = 0xff;
  }
  pDst[2].field_0.field_0.b = cVar8;
  pDst[2].field_0.field_0.a = 0xff;
  iVar7 = *(int *)(&DAT_0018f2ec + uVar9 * 0x10);
  iVar6 = r + iVar7;
  iVar3 = g + iVar7;
  iVar7 = iVar7 + b;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  cVar8 = (component_t)iVar6;
  if (0xfe < iVar6) {
    cVar8 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  pDst[3].field_0.field_0.r = cVar8;
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  pDst[3].field_0.field_0.g = (component_t)iVar3;
  pDst[3].field_0.field_0.b = (component_t)iVar7;
  pDst[3].field_0.field_0.a = 0xff;
  return bVar2;
}

Assistant:

bool etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint16 packed_delta3, uint table_idx)
        {
            RG_ETC1_ASSERT(table_idx < cETC1IntenModifierValues);
            const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

            uint r, g, b;
            bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

            const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

            const int y0 = pInten_modifer_table[0];
            pDst[0].set(ir + y0, ig + y0, ib + y0);

            const int y1 = pInten_modifer_table[1];
            pDst[1].set(ir + y1, ig + y1, ib + y1);

            const int y2 = pInten_modifer_table[2];
            pDst[2].set(ir + y2, ig + y2, ib + y2);

            const int y3 = pInten_modifer_table[3];
            pDst[3].set(ir + y3, ig + y3, ib + y3);

            return success;
        }